

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

bool __thiscall DynamicGraph::checkComponentNotBreak(DynamicGraph *this,Vertex v,Vertex u,Edge e)

{
  value_type vVar1;
  ulong uVar2;
  Vertex w_00;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  Delete *pDVar6;
  reference pvVar7;
  Vertex w;
  list<unsigned_long,_std::allocator<unsigned_long>_> queue;
  Delete *local_a0;
  unsigned_long local_98;
  unsigned_long uStack_90;
  property_type *local_88;
  Delete *local_68;
  Vertex local_60;
  Vertex tmp;
  list<unsigned_long,_std::allocator<unsigned_long>_> incVertices;
  list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
  actions;
  Vertex u_local;
  Vertex v_local;
  DynamicGraph *this_local;
  
  u_local = v;
  v_local = (Vertex)this;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->level,v);
  vVar1 = *pvVar4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->level,u);
  if (vVar1 == *pvVar4) {
    this->halt = true;
    pvVar5 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,u_local);
    std::
    set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&pvVar5->b_sibl,&e);
    pvVar5 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[](&this->relatives,u);
    std::
    set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&pvVar5->b_sibl,&e);
  }
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->level,u_local);
  vVar1 = *pvVar4;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->level,u);
  if (vVar1 != *pvVar4) {
    std::__cxx11::
    list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
    ::list((list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
            *)&incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               _M_node._M_size);
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&tmp);
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->level,u_local);
    uVar2 = *pvVar4;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->level,u);
    actions.
    super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
    ._M_impl._M_node._M_size = u;
    if (uVar2 < *pvVar4) {
      local_60 = u_local;
      actions.
      super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
      ._M_impl._M_node._M_size = u_local;
      u_local = u;
    }
    pDVar6 = (Delete *)operator_new(0x28);
    pvVar5 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,
                        actions.
                        super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                        ._M_impl._M_node._M_size);
    local_88 = e.m_eproperty;
    local_98 = e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
    uStack_90 = e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
    Delete::Delete(pDVar6,&pvVar5->c_succ,e);
    local_68 = pDVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)&incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl._M_node._M_size,&local_68);
    pvVar5 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,
                        actions.
                        super__List_base<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                        ._M_impl._M_node._M_size);
    std::
    set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&pvVar5->c_succ,&e);
    pDVar6 = (Delete *)operator_new(0x28);
    pvVar5 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,u_local);
    Delete::Delete(pDVar6,&pvVar5->a_pred,e);
    local_a0 = pDVar6;
    std::__cxx11::
    list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
    ::emplace_front<Delete*>
              ((list<std::unique_ptr<Action,std::default_delete<Action>>,std::allocator<std::unique_ptr<Action,std::default_delete<Action>>>>
                *)&incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl._M_node._M_size,&local_a0);
    pvVar5 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,u_local);
    std::
    set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
    ::erase(&pvVar5->a_pred,&e);
    pvVar5 = std::vector<Relatives,_std::allocator<Relatives>_>::operator[]
                       (&this->relatives,u_local);
    bVar3 = std::
            set<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
            ::empty(&pvVar5->a_pred);
    if (bVar3) {
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&w,&u_local);
      do {
        bVar3 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
        if (((bVar3 ^ 0xffU) & 1) == 0) {
          queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
          _M_size._4_4_ = 0;
          goto LAB_0011633f;
        }
        pvVar7 = std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::front
                           ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
        w_00 = *pvVar7;
        std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                  ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
        dropLevel(this,w_00,(list<unsigned_long,_std::allocator<unsigned_long>_> *)&w,
                  (list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                   *)&incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl._M_node._M_size,
                  (list<unsigned_long,_std::allocator<unsigned_long>_> *)&tmp);
      } while ((this->halt & 1U) == 0);
      rollBack(this,(list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
                     *)&incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl._M_node._M_size,
               (list<unsigned_long,_std::allocator<unsigned_long>_> *)&tmp);
      this_local._7_1_ = 0;
      queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size.
      _4_4_ = 1;
LAB_0011633f:
      std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
                ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&w);
      if (queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
          _M_size._4_4_ == 0) {
        this->halt = true;
        queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
        _M_size._4_4_ = 0;
      }
    }
    else {
      this->halt = true;
      this_local._7_1_ = 1;
      queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size.
      _4_4_ = 1;
    }
    std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::~list
              ((list<unsigned_long,_std::allocator<unsigned_long>_> *)&tmp);
    std::__cxx11::
    list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
    ::~list((list<std::unique_ptr<Action,_std::default_delete<Action>_>,_std::allocator<std::unique_ptr<Action,_std::default_delete<Action>_>_>_>
             *)&incVertices.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                _M_node._M_size);
    if (queue.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
        _M_size._4_4_ != 0) goto LAB_001163ab;
  }
  this_local._7_1_ = 1;
LAB_001163ab:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DynamicGraph::checkComponentNotBreak(Vertex v, Vertex u, Edge e)
{
    // Case 1: v and u are on the same level
    if (this->level[v]==this->level[u]) {
        this->halt = true;
        this->relatives[v].b_sibl.erase(e);
        this->relatives[u].b_sibl.erase(e);
    }

    // Case 2: v and u are on different levels
    if (this->level[v]!=this->level[u]) {
        std::list<std::unique_ptr<Action>> actions; // changes stack
        std::list<Vertex> incVertices; // vertices dropped stack (each vertex multible times)
        // For Generality u in Li-1 and v Li
        if (this->level[v] < this->level[u]) {
            Vertex tmp = v;
            v = u;
            u = tmp;
        }

        actions.emplace_front(new Delete(this->relatives[u].c_succ, e));
        this->relatives[u].c_succ.erase(e);
        actions.emplace_front(new Delete(this->relatives[v].a_pred, e));
        this->relatives[v].a_pred.erase(e);

        // Case 2.1: a_pred(v) is not empty
        if(!this->relatives[v].a_pred.empty()) {
            this->halt = true;
            return true;
        }
        // Case 2.2 a_pred(v) is empty
        else {
            std::list<Vertex> queue;
            queue.push_back(v);

            // If Q is empty, the procedure and both processes halt
            while(!queue.empty()) {
                // Let w be the first element of Q. Remove w from Q
                Vertex w = queue.front();
                queue.pop_front();
                dropLevel(w, queue, actions, incVertices);

                // Repeat
                if(this->halt) {
                    this->rollBack(actions, incVertices);
                    return false;
                }
            }
        }
        this->halt = true;
    }
    return true;
}